

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::api::json::PsbtBip32Data::ConvertFromStruct(PsbtBip32Data *this,PsbtBip32DataStruct *data)

{
  string *in_RSI;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  
  std::__cxx11::string::operator=((string *)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header,in_RSI);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_node_count,in_RSI + 0x20);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_left,in_RSI + 0x40
            );
  std::__cxx11::string::operator=
            ((string *)&in_RDI[3]._M_t._M_impl.super__Rb_tree_header,in_RSI + 0x60);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RSI,in_RDI);
  return;
}

Assistant:

void PsbtBip32Data::ConvertFromStruct(
    const PsbtBip32DataStruct& data) {
  pubkey_ = data.pubkey;
  master_fingerprint_ = data.master_fingerprint;
  path_ = data.path;
  descriptor_ = data.descriptor;
  ignore_items = data.ignore_items;
}